

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::UDFWrapper::
CreateAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::dtime_t>
          (AggregateFunction *__return_storage_ptr__,UDFWrapper *this,string *name,
          LogicalType *ret_type,LogicalType *input_type)

{
  bool bVar1;
  runtime_error *this_00;
  
  bVar1 = TypesMatch<duckdb::dtime_t>((LogicalType *)name);
  if (bVar1) {
    bVar1 = TypesMatch<duckdb::dtime_t>(ret_type);
    if (bVar1) {
      CreateUnaryAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::dtime_t>
                (__return_storage_ptr__,this,name,ret_type,input_type);
      return __return_storage_ptr__;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"The input argument don\'t match!");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"The return argument don\'t match!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline static AggregateFunction CreateAggregateFunction(const string &name, const LogicalType &ret_type,
	                                                        const LogicalType &input_type) {
		if (!TypesMatch<TR>(ret_type)) { // LCOV_EXCL_START
			throw std::runtime_error("The return argument don't match!");
		} // LCOV_EXCL_STOP

		if (!TypesMatch<TA>(input_type)) { // LCOV_EXCL_START
			throw std::runtime_error("The input argument don't match!");
		} // LCOV_EXCL_STOP

		return CreateUnaryAggregateFunction<UDF_OP, STATE, TR, TA>(name, ret_type, input_type);
	}